

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Statement * ifStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  Expression *pEVar1;
  TokenList *pTVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  Block BVar7;
  Statement local_70;
  
  __return_storage_ptr__->type = STATEMENT_IF;
  (__return_storage_ptr__->field_1).blockStatement.numStatements = (head->value).line;
  iVar4 = 0;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).ifStatement.elseBranch.numStatements = 0;
  consume((Token *)&local_70,TOKEN_LEFT_PAREN,
          "Conditionals must start with an openning brace[\'(\'] after If!");
  pEVar1 = expression();
  (__return_storage_ptr__->field_1).ifStatement.condition = pEVar1;
  consume((Token *)&local_70,TOKEN_RIGHT_PAREN,
          "Conditional must end with a closing brace[\')\'] after If!");
  consume((Token *)&local_70,TOKEN_NEWLINE,"Expected newline after If!");
  if ((head->value).type == TOKEN_INDENT) {
    iVar4 = 0;
    pTVar2 = head;
    do {
      iVar4 = iVar4 + 1;
      pTVar2 = pTVar2->next;
    } while ((pTVar2->value).type == TOKEN_INDENT);
  }
  iVar5 = compiler->indentLevel;
  if (iVar4 == iVar5) {
    if (0 < iVar5) {
      iVar5 = iVar5 + 1;
      do {
        consume((Token *)&local_70,TOKEN_INDENT,"Expected indent!");
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    consume((Token *)&local_70,TOKEN_THEN,"Expected Then on the same indent!");
    consume((Token *)&local_70,TOKEN_NEWLINE,"Expected newline after Then!");
  }
  BVar7 = blockStatement(compiler,BLOCK_IF);
  (__return_storage_ptr__->field_1).ifStatement.thenBranch = BVar7;
  if (0 < compiler->indentLevel) {
    iVar4 = compiler->indentLevel + 1;
    do {
      consume((Token *)&local_70,TOKEN_INDENT,"Expected indent!");
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  if (head == (TokenList *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = (head->value).type == TOKEN_ELSE;
  }
  if (bVar6) {
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (bVar6) {
      if (head == (TokenList *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = (head->value).type == TOKEN_IF;
      }
      if (bVar6) {
        if (head->next != (TokenList *)0x0) {
          head = head->next;
        }
        if (bVar6) {
          ifStatement(&local_70,compiler);
          puVar3 = (undefined8 *)malloc(0x40);
          *puVar3 = local_70._0_8_;
          puVar3[1] = local_70.field_1._0_8_;
          puVar3[2] = local_70.field_1.blockStatement.statements;
          puVar3[3] = local_70.field_1.breakStatement.pos.file;
          puVar3[4] = local_70.field_1.ifStatement.thenBranch.statements;
          puVar3[5] = local_70.field_1._32_8_;
          puVar3[6] = local_70.field_1.ifStatement.elseBranch.statements;
          puVar3[7] = local_70.field_1.routine.code.statements;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x100000001;
          *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x28) = puVar3;
          return __return_storage_ptr__;
        }
      }
      consume((Token *)&local_70,TOKEN_NEWLINE,"Expected newline after Else!");
      BVar7 = blockStatement(compiler,BLOCK_ELSE);
      (__return_storage_ptr__->field_1).ifStatement.elseBranch = BVar7;
      if (0 < compiler->indentLevel) {
        iVar4 = compiler->indentLevel + 1;
        do {
          consume((Token *)&local_70,TOKEN_INDENT,"Expected indent!");
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
    }
  }
  consume((Token *)&local_70,TOKEN_ENDIF,"Expected EndIf after If!");
  consume((Token *)&local_70,TOKEN_NEWLINE,"Expected newline after EndIf!");
  return __return_storage_ptr__;
}

Assistant:

static Statement ifStatement(Compiler *compiler){
    debug("Parsing if statement");
    Statement s;
    s.type = STATEMENT_IF;
    s.ifStatement.line = presentLine();
    s.ifStatement.thenBranch.numStatements = 0;
    s.ifStatement.elseBranch.numStatements = 0;

    consume(TOKEN_LEFT_PAREN, "Conditionals must start with an openning brace['('] after If!");
    s.ifStatement.condition = expression();
    consume(TOKEN_RIGHT_PAREN, "Conditional must end with a closing brace[')'] after If!");
    consume(TOKEN_NEWLINE, "Expected newline after If!");

    if(getNextIndent() == compiler->indentLevel){
        consumeIndent(compiler->indentLevel);
        consume(TOKEN_THEN, "Expected Then on the same indent!");
        consume(TOKEN_NEWLINE, "Expected newline after Then!");
    }

    s.ifStatement.thenBranch = blockStatement(compiler, BLOCK_IF);
    consumeIndent(compiler->indentLevel);

    if(match(TOKEN_ELSE)){
        if(match(TOKEN_IF)){
            Block elseifBlock = {0, BLOCK_ELSE, NULL};
            addToBlock(&elseifBlock, ifStatement(compiler));
            s.ifStatement.elseBranch = elseifBlock;
        }
        else{
            consume(TOKEN_NEWLINE, "Expected newline after Else!");
            s.ifStatement.elseBranch = blockStatement(compiler, BLOCK_ELSE);
            consumeIndent(compiler->indentLevel);
            consume(TOKEN_ENDIF, "Expected EndIf after If!");
            consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
        }
    }
    else{
        consume(TOKEN_ENDIF, "Expected EndIf after If!");
        consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
    }
    debug("If statement parsed");

    return s;
}